

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_ring_buffer.cc
# Opt level: O0

void __thiscall
webrtc::AudioRingBuffer::MoveReadPositionBackward(AudioRingBuffer *this,size_t frames)

{
  bool bVar1;
  int iVar2;
  reference ppRVar3;
  FatalMessage local_1c0;
  string *local_48;
  string *_result;
  size_t moved;
  RingBuffer *buf;
  iterator __end1;
  iterator __begin1;
  vector<RingBuffer_*,_std::allocator<RingBuffer_*>_> *__range1;
  size_t frames_local;
  AudioRingBuffer *this_local;
  
  __range1 = (vector<RingBuffer_*,_std::allocator<RingBuffer_*>_> *)frames;
  frames_local = (size_t)this;
  __end1 = std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>::begin(&this->buffers_);
  buf = (RingBuffer *)std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>::end(&this->buffers_)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<RingBuffer_**,_std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>_>
                                *)&buf);
    if (!bVar1) {
      return;
    }
    ppRVar3 = __gnu_cxx::
              __normal_iterator<RingBuffer_**,_std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>_>
              ::operator*(&__end1);
    moved = (size_t)*ppRVar3;
    iVar2 = WebRtc_MoveReadPtr((RingBuffer *)moved,-(int)__range1);
    _result = (string *)(long)-iVar2;
    local_48 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&_result,(unsigned_long *)&__range1,"moved == frames");
    if (local_48 != (string *)0x0) break;
    __gnu_cxx::
    __normal_iterator<RingBuffer_**,_std::vector<RingBuffer_*,_std::allocator<RingBuffer_*>_>_>::
    operator++(&__end1);
  }
  rtc::FatalMessage::FatalMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_ring_buffer.cc"
             ,0x47,local_48);
  rtc::FatalMessage::stream(&local_1c0);
  rtc::FatalMessage::~FatalMessage(&local_1c0);
}

Assistant:

void AudioRingBuffer::MoveReadPositionBackward(size_t frames) {
  for (auto buf : buffers_) {
    const size_t moved = static_cast<size_t>(
        -WebRtc_MoveReadPtr(buf, -static_cast<int>(frames)));
    RTC_CHECK_EQ(moved, frames);
  }
}